

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool __thiscall sf::Image::loadFromFile(Image *this,string *filename)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  string *in_stack_00000020;
  ImageLoader *in_stack_00000028;
  
  priv::ImageLoader::getInstance();
  bVar1 = priv::ImageLoader::loadImageFromFile
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018,&this->m_size);
  return bVar1;
}

Assistant:

bool Image::loadFromFile(const std::string& filename)
{
    #ifndef SFML_SYSTEM_ANDROID

        return priv::ImageLoader::getInstance().loadImageFromFile(filename, m_pixels, m_size);

    #else

        priv::ResourceStream stream(filename);
        return loadFromStream(stream);

    #endif
}